

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O1

void dg::llvmdg::LLVMSlicer::reconnectBBlock(LLVMBBlock *BB,BasicBlock *llvmBB)

{
  size_t sVar1;
  _Base_ptr p_Var2;
  BasicBlock *pBVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  LLVMContext *pLVar6;
  BranchInst *this;
  ReturnInst *pRVar7;
  Value *pVVar8;
  IntegerType *pIVar9;
  undefined1 auVar10 [16];
  
  lVar4 = llvm::BasicBlock::getTerminator();
  if (lVar4 != 0) {
    for (p_Var5 = (BB->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(BB->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      if (*(byte *)&p_Var5[1]._M_parent != 0xff) {
        llvm::Instruction::setSuccessor
                  ((uint)lVar4,(BasicBlock *)(ulong)*(byte *)&p_Var5[1]._M_parent);
      }
    }
    return;
  }
  pLVar6 = (LLVMContext *)llvm::BasicBlock::getContext();
  lVar4 = *(long *)(llvmBB + 0x38);
  sVar1 = (BB->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    if (*(char *)(**(long **)(*(long *)(lVar4 + 0x18) + 0x10) + 8) != '\a') {
      auVar10 = llvm::Value::getName();
      if ((auVar10._8_8_ == 4) && (*auVar10._0_8_ == 0x6e69616d)) {
        pIVar9 = (IntegerType *)llvm::Type::getInt32Ty(pLVar6);
        pVVar8 = (Value *)llvm::ConstantInt::get(pIVar9,0,false);
      }
      else {
        pVVar8 = (Value *)llvm::UndefValue::get
                                    ((Type *)**(undefined8 **)(*(long *)(lVar4 + 0x18) + 0x10));
      }
      pRVar7 = (ReturnInst *)llvm::User::operator_new(0x40,(uint)(pVVar8 != (Value *)0x0));
      llvm::ReturnInst::ReturnInst(pRVar7,pLVar6,pVVar8,llvmBB);
      return;
    }
    pRVar7 = (ReturnInst *)llvm::User::operator_new(0x40,0);
    llvm::ReturnInst::ReturnInst(pRVar7,pLVar6,llvmBB);
    return;
  }
  if ((sVar1 == 1) &&
     (p_Var2 = (BB->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
     *(char *)&p_Var2[1]._M_parent != -1)) {
    pBVar3 = (BasicBlock *)**(undefined8 **)(p_Var2 + 1);
    this = (BranchInst *)llvm::User::operator_new(0x40,1);
    llvm::BranchInst::BranchInst(this,pBVar3,llvmBB);
    return;
  }
  abort();
}

Assistant:

static void reconnectBBlock(LLVMBBlock *BB, llvm::BasicBlock *llvmBB) {
        using namespace llvm;

        auto *tinst = llvmBB->getTerminator();
        assert((!tinst || BB->successorsNum() <= 2 ||
                llvm::isa<llvm::SwitchInst>(tinst)) &&
               "BB has more than two successors (and it's not a switch)");

        if (!tinst) {
            // block has no terminator
            // It may occur for example if we have:
            //
            //   call error()
            //   br %exit
            //
            //  The br instruction has no meaning when error() abort,
            //  but if error is not marked as noreturn, then the br
            //  will be there and will get sliced, making the block
            //  unterminated. The same may happen if we remove unconditional
            //  branch inst

            LLVMContext &Ctx = llvmBB->getContext();
            Function *F = cast<Function>(llvmBB->getParent());
            bool create_return = true;

            if (BB->successorsNum() == 1) {
                const LLVMBBlock::BBlockEdge &edge =
                        *(BB->successors().begin());
                if (edge.label != LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL) {
                    // don't create return, we created branchinst
                    create_return = false;

                    BasicBlock *succ = cast<BasicBlock>(edge.target->getKey());
                    BranchInst::Create(succ, llvmBB);
                }
            }

            if (create_return) {
                if (BB->successorsNum() != 0) {
                    assert(BB->successorsNum() == 0 &&
                           "Creating return to BBlock that has successors");
                    abort();
                }

                if (F->getReturnType()->isVoidTy())
                    ReturnInst::Create(Ctx, llvmBB);
                else if (F->getName().equals("main"))
                    // if this is main, than the safe exit equals to returning 0
                    // (it is just for convenience, we wouldn't need to do this)
                    ReturnInst::Create(
                            Ctx, ConstantInt::get(Type::getInt32Ty(Ctx), 0),
                            llvmBB);
                else
                    ReturnInst::Create(Ctx, UndefValue::get(F->getReturnType()),
                                       llvmBB);
            }

            // and that is all we can do here
            return;
        }

        for (const LLVMBBlock::BBlockEdge &succ : BB->successors()) {
            // skip artificial return basic block
            if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL)
                continue;

            llvm::Value *val = succ.target->getKey();
            assert(val && "nullptr as BB's key");
            llvm::BasicBlock *llvmSucc = llvm::cast<llvm::BasicBlock>(val);
            tinst->setSuccessor(succ.label, llvmSucc);
        }

        // if the block still does not have terminator
    }